

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O2

bool __thiscall PackedVertexPNTCUV::operator==(PackedVertexPNTCUV *this,PackedVertexPNTCUV *other)

{
  bool bVar1;
  
  bVar1 = is_near(&this->position,&other->position);
  if (bVar1) {
    bVar1 = is_near(&this->normal,&other->normal);
    if (bVar1) {
      bVar1 = is_near(&this->tangent,&other->tangent);
      if (bVar1) {
        bVar1 = is_near(&this->uv,&other->uv);
        if (bVar1) {
          bVar1 = is_near(&this->color,&other->color);
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const PackedVertexPNTCUV & other) const
  {
    return is_near(position, other.position) and is_near(normal, other.normal) and is_near(tangent, other.tangent) and is_near(uv, other.uv) and is_near(color, other.color);
  }